

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateInit2_(z_streamp_conflict strm,int windowBits,char *version,int stream_size)

{
  internal_state *piVar1;
  inflate_state *state;
  int stream_size_local;
  char *version_local;
  int windowBits_local;
  z_streamp_conflict strm_local;
  
  if (((version == (char *)0x0) || (*version != '1')) || (stream_size != 0x70)) {
    strm_local._4_4_ = -6;
  }
  else if (strm == (z_streamp_conflict)0x0) {
    strm_local._4_4_ = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = cm_zlib_zcalloc;
      strm->opaque = (voidpf)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = cm_zlib_zcfree;
    }
    piVar1 = (internal_state *)(*strm->zalloc)(strm->opaque,1,0x2550);
    if (piVar1 == (internal_state *)0x0) {
      strm_local._4_4_ = -4;
    }
    else {
      strm->state = piVar1;
      if (windowBits < 0) {
        piVar1[2].dummy = 0;
        version_local._4_4_ = -windowBits;
      }
      else {
        piVar1[2].dummy = (windowBits >> 4) + 1;
        version_local._4_4_ = windowBits;
        if (windowBits < 0x30) {
          version_local._4_4_ = windowBits & 0xf;
        }
      }
      if (((int)version_local._4_4_ < 8) || (0xf < (int)version_local._4_4_)) {
        (*strm->zfree)(strm->opaque,piVar1);
        strm->state = (internal_state *)0x0;
        strm_local._4_4_ = -2;
      }
      else {
        piVar1[0xc].dummy = version_local._4_4_;
        *(undefined8 *)(piVar1 + 0x10) = 0;
        strm_local._4_4_ = cm_zlib_inflateReset(strm);
      }
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateInit2_(strm, windowBits, version, stream_size)
z_streamp strm;
int windowBits;
const char *version;
int stream_size;
{
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL) return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
    }
    if (strm->zfree == (free_func)0) strm->zfree = zcfree;
    state = (struct inflate_state FAR *)
            ZALLOC(strm, 1, sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    if (windowBits < 0) {
        state->wrap = 0;
        windowBits = -windowBits;
    }
    else {
        state->wrap = (windowBits >> 4) + 1;
#ifdef GUNZIP
        if (windowBits < 48) windowBits &= 15;
#endif
    }
    if (windowBits < 8 || windowBits > 15) {
        ZFREE(strm, state);
        strm->state = Z_NULL;
        return Z_STREAM_ERROR;
    }
    state->wbits = (unsigned)windowBits;
    state->window = Z_NULL;
    return inflateReset(strm);
}